

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_recover
              (secp256k1_context *ctx,uchar *deckey32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig162,secp256k1_pubkey *enckey)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  size_t size;
  secp256k1_scalar adaptor_sigr;
  secp256k1_scalar local_1c8;
  uchar enckey_expected33 [33];
  uchar enckey33 [33];
  secp256k1_scalar local_148;
  secp256k1_scalar local_128;
  secp256k1_ge enckey_expected_ge;
  secp256k1_gej enckey_expected_gej;
  
  size = 0x21;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar11 = (ctx->illegal_callback).data;
    pcVar12 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (deckey32 == (uchar *)0x0) {
    pvVar11 = (ctx->illegal_callback).data;
    pcVar12 = "deckey32 != NULL";
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar11 = (ctx->illegal_callback).data;
    pcVar12 = "sig != NULL";
  }
  else if (adaptor_sig162 == (uchar *)0x0) {
    pvVar11 = (ctx->illegal_callback).data;
    pcVar12 = "adaptor_sig162 != NULL";
  }
  else {
    if (enckey != (secp256k1_pubkey *)0x0) {
      iVar8 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)0x0,&adaptor_sigr,(secp256k1_ge *)0x0,&local_148,
                         (secp256k1_scalar *)0x0,(secp256k1_scalar *)0x0,adaptor_sig162);
      if (iVar8 == 0) {
        return 0;
      }
      uVar4 = *(uint64_t *)(sig->data + 0x20);
      uVar5 = *(uint64_t *)(sig->data + 0x28);
      uVar6 = *(uint64_t *)(sig->data + 0x30);
      uVar7 = *(uint64_t *)(sig->data + 0x38);
      uVar10 = adaptor_sigr.d[0] ^ *(ulong *)sig->data;
      uVar1 = *(uint64_t *)(sig->data + 8);
      uVar2 = *(uint64_t *)(sig->data + 0x10);
      uVar3 = *(uint64_t *)(sig->data + 0x18);
      local_128.d[0]._0_4_ = (int)uVar4;
      local_128.d[0]._4_4_ = (int)(uVar4 >> 0x20);
      local_128.d[1]._0_4_ = (int)uVar5;
      local_128.d[1]._4_4_ = (int)(uVar5 >> 0x20);
      local_128.d[2]._0_4_ = (int)uVar6;
      local_128.d[2]._4_4_ = (int)(uVar6 >> 0x20);
      local_128.d[3]._0_4_ = (int)uVar7;
      local_128.d[3]._4_4_ = (int)(uVar7 >> 0x20);
      auVar13._0_4_ = -(uint)((int)local_128.d[0] == 0 && (int)local_128.d[2] == 0);
      auVar13._4_4_ = -(uint)(local_128.d[0]._4_4_ == 0 && local_128.d[2]._4_4_ == 0);
      auVar13._8_4_ = -(uint)((int)local_128.d[1] == 0 && (int)local_128.d[3] == 0);
      auVar13._12_4_ = -(uint)(local_128.d[1]._4_4_ == 0 && local_128.d[3]._4_4_ == 0);
      iVar8 = movmskps((int)uVar10,auVar13);
      local_128.d[0] = uVar4;
      local_128.d[1] = uVar5;
      local_128.d[2] = uVar6;
      local_128.d[3] = uVar7;
      secp256k1_scalar_inverse(&local_1c8,&local_128);
      secp256k1_scalar_mul(&local_1c8,&local_1c8,&local_148);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&enckey_expected_gej,&local_1c8);
      secp256k1_ge_set_gej(&enckey_expected_ge,&enckey_expected_gej);
      iVar9 = secp256k1_eckey_pubkey_serialize(&enckey_expected_ge,enckey_expected33,&size,0x102);
      if (iVar9 == 0) {
        return 0;
      }
      iVar9 = secp256k1_ec_pubkey_serialize(ctx,enckey33,&size,enckey,0x102);
      if (iVar9 == 0) {
        return 0;
      }
      iVar9 = secp256k1_memcmp_var(enckey_expected33 + 1,enckey33 + 1,0x20);
      if (iVar9 != 0) {
        return 0;
      }
      if (enckey_expected33[0] != enckey33[0]) {
        secp256k1_scalar_negate(&local_1c8,&local_1c8);
      }
      secp256k1_scalar_get_b32(deckey32,&local_1c8);
      return (uint)((adaptor_sigr.d[3] == uVar3 &&
                    (adaptor_sigr.d[2] == uVar2 && (adaptor_sigr.d[1] == uVar1 && uVar10 == 0))) &&
                   iVar8 != 0xf);
    }
    pvVar11 = (ctx->illegal_callback).data;
    pcVar12 = "enckey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar12,pvVar11);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_recover(const secp256k1_context* ctx, unsigned char *deckey32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig162, const secp256k1_pubkey *enckey) {
    secp256k1_scalar sp, adaptor_sigr;
    secp256k1_scalar s, r;
    secp256k1_scalar deckey;
    secp256k1_ge enckey_expected_ge;
    secp256k1_gej enckey_expected_gej;
    unsigned char enckey33[33];
    unsigned char enckey_expected33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &adaptor_sigr, NULL, &sp, NULL, NULL, adaptor_sig162)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    /* Check that we're not looking at some unrelated signature */
    ret &= secp256k1_scalar_eq(&adaptor_sigr, &r);
    /* y = s⁻¹ * s' */
    ret &= !secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_inverse(&deckey, &s);
    secp256k1_scalar_mul(&deckey, &deckey, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &enckey_expected_gej, &deckey);
    secp256k1_ge_set_gej(&enckey_expected_ge, &enckey_expected_gej);
    /* We declassify non-secret enckey_expected_ge to allow using it as a
     * branch point. */
    secp256k1_declassify(ctx, &enckey_expected_ge, sizeof(enckey_expected_ge));
    if (!secp256k1_eckey_pubkey_serialize(&enckey_expected_ge, enckey_expected33, &size, SECP256K1_EC_COMPRESSED)) {
        /* Unreachable from tests (and other VERIFY builds) and therefore this
         * branch should be ignored in test coverage analysis.
         *
         * Proof:
         *     eckey_pubkey_serialize fails <=> deckey = 0
         *     deckey = 0 <=> s^-1 = 0 or sp = 0
         *     case 1: s^-1 = 0 impossible by the definition of multiplicative
         *             inverse and because the scalar_inverse implementation
         *             VERIFY_CHECKs that the inputs are valid scalars.
         *     case 2: sp = 0 impossible because ecdsa_adaptor_sig_deserialize would have already failed
         */
        return 0;
    }
    if (!secp256k1_ec_pubkey_serialize(ctx, enckey33, &size, enckey, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    if (secp256k1_memcmp_var(&enckey_expected33[1], &enckey33[1], 32) != 0) {
        return 0;
    }
    if (enckey_expected33[0] != enckey33[0]) {
        /* try Y_implied == -Y */
        secp256k1_scalar_negate(&deckey, &deckey);
    }
    secp256k1_scalar_get_b32(deckey32, &deckey);

    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}